

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  bool bVar1;
  uint field_count;
  undefined7 extraout_var;
  FastFieldValuePrinter *pFVar2;
  Message *message_00;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  DynamicMessageFactory factory;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_a8;
  undefined4 local_8c;
  FieldDescriptor *local_88;
  _func_void_FieldDescriptor_ptr *local_80;
  DynamicMessageFactory local_78;
  
  if ((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x3c) == 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_78.super_MessageFactory._vptr_MessageFactory =
           (_func_int **)FieldDescriptor::TypeOnceInit;
      local_a8.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                 (FieldDescriptor **)&local_a8);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_78.super_MessageFactory._vptr_MessageFactory =
             (_func_int **)FieldDescriptor::TypeOnceInit;
        local_a8.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                   (FieldDescriptor **)&local_a8);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
        PrintShortRepeatedField(this,message,reflection,field,generator);
        return;
      }
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    field_count = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar1 = Reflection::HasField(reflection,message,field);
    if ((bVar1) ||
       (field_count = 0, *(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\x01')) {
      field_count = 1;
    }
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_78);
  local_a8.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_80 = FieldDescriptor::TypeOnceInit;
    local_88 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_80,&local_88);
  }
  if (*(int *)(field + 0x38) == 0xb) {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    local_8c = (undefined4)CONCAT71(extraout_var,bVar1);
  }
  else {
    local_8c = 0;
  }
  if ((char)local_8c == '\0') {
    bVar1 = false;
  }
  else {
    bVar1 = internal::MapFieldPrinterHelper::SortMap
                      (message,reflection,field,&local_78.super_MessageFactory,&local_a8);
  }
  uVar3 = (ulong)field_count;
  if (0 < (int)field_count) {
    uVar6 = 0;
    do {
      uVar5 = 0xffffffff;
      if (*(int *)(field + 0x3c) == 3) {
        uVar5 = uVar6 & 0xffffffff;
      }
      PrintFieldName(this,message,(int)uVar5,field_count,reflection,field,generator);
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_80 = FieldDescriptor::TypeOnceInit;
        local_88 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_80,&local_88);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        pFVar2 = GetFieldPrinter(this,field);
        if (*(int *)(field + 0x3c) == 3) {
          if ((char)local_8c == '\0') {
            message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(int)uVar6);
          }
          else {
            message_00 = local_a8.
                         super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6];
          }
        }
        else {
          message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        (*pFVar2->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar2,message_00,uVar5,uVar3,(ulong)this->single_line_mode_,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        Print(this,message_00,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (*pFVar2->_vptr_FastFieldValuePrinter[0xf])
                  (pFVar2,message_00,uVar5,uVar3,(ulong)this->single_line_mode_,generator);
      }
      else {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        PrintFieldValue(this,message,reflection,field,(int)uVar5,generator);
        pcVar4 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar4 = " ";
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar4,1);
      }
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  if ((bVar1 != false) &&
     (local_a8.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a8.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    uVar3 = 0;
    do {
      if (local_a8.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3] != (Message *)0x0) {
        (*(local_a8.
           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar3]->super_MessageLite)._vptr_MessageLite[1]
        )();
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_a8.
                                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.
                                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_a8.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&local_78);
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  DynamicMessageFactory factory;
  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &factory, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      Print(sub_message, generator);
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintLiteral(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (int j = 0; j < sorted_map_field.size(); ++j) {
      delete sorted_map_field[j];
    }
  }
}